

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O2

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::CheckProtoChainInternal
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *prototype)

{
  Type TVar1;
  Type *type;
  ScriptContext *pSVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  
  if (prototype == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0xc0,"(prototype)","prototype");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  type = (prototype->type).ptr;
  pSVar2 = (((type->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar5 = true;
  pTVar8 = type;
  while (TVar1 = pTVar8->typeId, TVar1 != TypeIds_Null) {
    if (TVar1 == TypeIds_Proxy) goto LAB_009e11a6;
    pSVar3 = (((pTVar8->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    bVar6 = RecyclableObject::HasOnlyWritableDataProperties(prototype);
    if (!bVar6) goto LAB_009e11a6;
    bVar5 = (bool)(bVar5 & pSVar3 == pSVar2);
    prototype = RecyclableObject::GetPrototype(prototype);
    pTVar8 = (prototype->type).ptr;
  }
  if (bVar5) {
    OnlyWritablePropertyCache::Cache(type);
  }
LAB_009e11a6:
  return TVar1 == TypeIds_Null;
}

Assistant:

bool
PrototypeChainCache<T>::CheckProtoChainInternal(RecyclableObject* prototype)
{
    Assert(prototype);

    Type *const originalType = prototype->GetType();
    ScriptContext *const scriptContext = prototype->GetScriptContext();

    bool onlyOneScriptContext = true;
    TypeId typeId;
    for (; (typeId = prototype->GetTypeId()) != TypeIds_Null; prototype = prototype->GetPrototype())
    {
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
        if (prototype->GetScriptContext() != scriptContext)
        {
            onlyOneScriptContext = false;
        }
        if (!T::CheckObject(prototype))
        {
            return false;
        }
    }

    if (onlyOneScriptContext)
    {
        // Technically, we could register all prototypes in the chain but this is good enough for now
        T::Cache(originalType);
    }

    return true;
}